

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring64_bitmap_contains_range(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  art_ref_t ref;
  bool bVar1;
  uint32_t range_end;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  uint32_t range_start;
  ulong uVar5;
  _Bool _Var6;
  uint8_t min_high48 [6];
  uint8_t max_high48 [6];
  art_iterator_t it;
  uint local_d0;
  ushort local_cc;
  uint local_c8;
  ushort local_c4;
  art_iterator_t local_c0;
  
  _Var6 = true;
  if (min < max) {
    local_d0 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_cc = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_c8 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
               (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
    local_c4 = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
    _Var6 = false;
    memset(&local_c0,0,0x90);
    ref = (r->art).root;
    if (ref != 0) {
      local_c0.art = &r->art;
      art_node_iterator_lower_bound(ref,&local_c0,(art_key_chunk_t *)&local_d0);
      if ((local_c0.value == (ulong *)0x0) ||
         (uVar3 = (ulong)CONCAT24(local_c0.key._4_2_,local_c0.key._0_4_),
         min < (((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
                ((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
               uVar3 << 0x38))) {
        _Var6 = false;
      }
      else {
        uVar3 = max - 1 & 0xffffffffffff0000;
        uVar5 = min & 0xffffffffffff0000;
        if (local_c0.value != (ulong *)0x0) {
          uVar2 = uVar5;
          do {
            uVar5 = (ulong)CONCAT24(local_c0.key._4_2_,local_c0.key._0_4_);
            uVar5 = ((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
                    ((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff00000000) >> 8 |
                    (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                    (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
            bVar1 = uVar3 < uVar5;
            if (uVar3 < uVar5) {
              return bVar1;
            }
            if (0x10000 < uVar5 - uVar2) {
              return bVar1;
            }
            range_start = 0;
            if (local_cc == local_c0.key._4_2_ && local_d0 == local_c0.key._0_4_) {
              range_start = (uint)min & 0xffff;
            }
            uVar2 = *local_c0.value;
            if ((range_start == 0) &&
               ((local_c0.key._4_2_ ^ local_c4) != 0 || (local_c0.key._0_4_ ^ local_c8) != 0)) {
              piVar4 = (int *)r->containers[uVar2 >> 8];
              if ((uint8_t)uVar2 == '\x04') {
                uVar2 = (ulong)*(byte *)(piVar4 + 2);
                piVar4 = *(int **)piVar4;
              }
              if ((char)uVar2 == '\x03') {
                if (*piVar4 != 1) {
                  return bVar1;
                }
                if (**(short **)(piVar4 + 2) != 0) {
                  return bVar1;
                }
                if ((*(short **)(piVar4 + 2))[1] != -1) {
                  return bVar1;
                }
              }
              else if (*piVar4 != 0x10000) {
                return bVar1;
              }
            }
            else {
              range_end = (uint)max & 0xffff;
              if ((local_c0.key._4_2_ ^ local_c4) != 0 || (local_c0.key._0_4_ ^ local_c8) != 0) {
                range_end = 0x10000;
              }
              _Var6 = container_contains_range
                                (r->containers[uVar2 >> 8],range_start,range_end,(uint8_t)uVar2);
              if (!_Var6) {
                return bVar1;
              }
            }
            art_iterator_move(&local_c0,true);
            uVar2 = uVar5;
          } while (local_c0.value != (ulong *)0x0);
        }
        _Var6 = uVar5 == uVar3;
      }
    }
  }
  return _Var6;
}

Assistant:

bool roaring64_bitmap_contains_range(const roaring64_bitmap_t *r, uint64_t min,
                                     uint64_t max) {
    if (min >= max) {
        return true;
    }

    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);
    uint64_t max_high48_bits = (max - 1) & 0xFFFFFFFFFFFF0000;  // Inclusive

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    if (it.value == NULL || combine_key(it.key, 0) > min) {
        return false;
    }
    uint64_t prev_high48_bits = min & 0xFFFFFFFFFFFF0000;
    while (it.value != NULL) {
        uint64_t current_high48_bits = combine_key(it.key, 0);
        if (current_high48_bits > max_high48_bits) {
            // We've passed the end of the range with all containers containing
            // the range.
            return true;
        }
        if (current_high48_bits - prev_high48_bits > 0x10000) {
            // There is a gap in the iterator that falls in the range.
            return false;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint32_t container_min = 0;
        if (compare_high48(it.key, min_high48) == 0) {
            container_min = min_low16;
        }
        uint32_t container_max = 0xFFFF + 1;  // Exclusive
        if (compare_high48(it.key, max_high48) == 0) {
            container_max = max_low16;
        }

        // For the first and last containers we use container_contains_range,
        // for the intermediate containers we can use container_is_full.
        if (container_min == 0 && container_max == 0xFFFF + 1) {
            if (!container_is_full(get_container(r, leaf),
                                   get_typecode(leaf))) {
                return false;
            }
        } else if (!container_contains_range(get_container(r, leaf),
                                             container_min, container_max,
                                             get_typecode(leaf))) {
            return false;
        }
        prev_high48_bits = current_high48_bits;
        art_iterator_next(&it);
    }
    return prev_high48_bits == max_high48_bits;
}